

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *node;
  InstanceConfigRuleSyntax *pIVar1;
  ConfigRuleClauseSyntax *unaff_retaddr;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  node = deepClone<slang::syntax::ConfigInstanceIdentifierSyntax>
                   (in_stack_00000060,in_stack_00000058);
  not_null<slang::syntax::ConfigRuleClauseSyntax_*>::operator*
            ((not_null<slang::syntax::ConfigRuleClauseSyntax_*> *)0x5947c7);
  deepClone<slang::syntax::ConfigRuleClauseSyntax>
            ((ConfigRuleClauseSyntax *)node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const InstanceConfigRuleSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<InstanceConfigRuleSyntax>(
        node.instance.deepClone(alloc),
        node.topModule.deepClone(alloc),
        *deepClone(node.instanceNames, alloc),
        *deepClone<ConfigRuleClauseSyntax>(*node.ruleClause, alloc),
        node.semi.deepClone(alloc)
    );
}